

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::WriteBuild
          (cmGlobalNinjaGenerator *this,ostream *os,string *comment,string *rule,
          cmNinjaDeps *outputs,cmNinjaDeps *explicitDeps,cmNinjaDeps *implicitDeps,
          cmNinjaDeps *orderOnlyDeps,cmNinjaVars *variables,string *rspfile,int cmdLineLimit,
          bool *usedResponseFile)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  ostream *poVar3;
  string *psVar4;
  char *pcVar5;
  cmGlobalNinjaGenerator *this_00;
  pointer m2;
  pointer path;
  allocator local_2ba;
  allocator local_2b9;
  ostream *local_2b8;
  cmNinjaDeps *local_2b0;
  cmNinjaDeps *local_2a8;
  uint local_29c;
  string buildstr;
  string build;
  string local_248;
  string arguments;
  string assignments;
  string local_1c8;
  ostringstream variable_assignments;
  string local_1a0 [368];
  
  local_2b8 = os;
  if (rule->_M_string_length == 0) {
    m2 = (comment->_M_dataplus)._M_p;
    pcVar5 = "No rule for WriteBuildStatement! called with comment: ";
  }
  else {
    if ((outputs->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (outputs->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_29c = cmdLineLimit;
      local_2b0 = orderOnlyDeps;
      local_2a8 = implicitDeps;
      WriteComment(os,comment);
      arguments._M_dataplus._M_p = (pointer)&arguments.field_2;
      arguments._M_string_length = 0;
      arguments.field_2._M_local_buf[0] = '\0';
      for (path = (explicitDeps->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
          path != (explicitDeps->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; path = path + 1) {
        EncodePath(&buildstr,(cmGlobalNinjaGenerator *)comment,path);
        EncodeIdent(&build,&buildstr,local_2b8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &variable_assignments," ",&build);
        comment = (string *)&variable_assignments;
        std::__cxx11::string::append((string *)&arguments);
        std::__cxx11::string::~string((string *)&variable_assignments);
        std::__cxx11::string::~string((string *)&build);
        std::__cxx11::string::~string((string *)&buildstr);
      }
      if ((local_2a8->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (local_2a8->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar5 = " |";
        std::__cxx11::string::append((char *)&arguments);
        for (psVar4 = (local_2a8->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            psVar4 != (local_2a8->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish; psVar4 = psVar4 + 1) {
          EncodePath(&buildstr,(cmGlobalNinjaGenerator *)pcVar5,psVar4);
          EncodeIdent(&build,&buildstr,local_2b8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &variable_assignments," ",&build);
          pcVar5 = (char *)&variable_assignments;
          std::__cxx11::string::append((string *)&arguments);
          std::__cxx11::string::~string((string *)&variable_assignments);
          std::__cxx11::string::~string((string *)&build);
          std::__cxx11::string::~string((string *)&buildstr);
        }
      }
      if ((local_2b0->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (local_2b0->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar5 = " ||";
        std::__cxx11::string::append((char *)&arguments);
        for (psVar4 = (local_2b0->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            psVar4 != (local_2b0->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish; psVar4 = psVar4 + 1) {
          EncodePath(&buildstr,(cmGlobalNinjaGenerator *)pcVar5,psVar4);
          EncodeIdent(&build,&buildstr,local_2b8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &variable_assignments," ",&build);
          pcVar5 = (char *)&variable_assignments;
          std::__cxx11::string::append((string *)&arguments);
          std::__cxx11::string::~string((string *)&variable_assignments);
          std::__cxx11::string::~string((string *)&build);
          std::__cxx11::string::~string((string *)&buildstr);
        }
      }
      std::__cxx11::string::append((char *)&arguments);
      build._M_dataplus._M_p = (pointer)&build.field_2;
      build._M_string_length = 0;
      build.field_2._M_local_buf[0] = '\0';
      this_00 = (cmGlobalNinjaGenerator *)0x45c006;
      std::__cxx11::string::append((char *)&build);
      for (psVar4 = (outputs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          psVar4 != (outputs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish; psVar4 = psVar4 + 1) {
        EncodePath(&assignments,this_00,psVar4);
        EncodeIdent(&buildstr,&assignments,local_2b8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &variable_assignments," ",&buildstr);
        this_00 = (cmGlobalNinjaGenerator *)&variable_assignments;
        std::__cxx11::string::append((string *)&build);
        std::__cxx11::string::~string((string *)&variable_assignments);
        std::__cxx11::string::~string((string *)&buildstr);
        std::__cxx11::string::~string((string *)&assignments);
        if (this->ComputingUnknownDependencies == true) {
          EncodePath((string *)&variable_assignments,this_00,psVar4);
          this_00 = (cmGlobalNinjaGenerator *)&variable_assignments;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->CombinedBuildOutputs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variable_assignments);
          std::__cxx11::string::~string((string *)&variable_assignments);
        }
      }
      std::__cxx11::string::append((char *)&build);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &variable_assignments," ",rule);
      std::__cxx11::string::append((string *)&build);
      std::__cxx11::string::~string((string *)&variable_assignments);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&variable_assignments);
      for (p_Var2 = (variables->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &(variables->_M_t)._M_impl.super__Rb_tree_header;
          p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
        std::__cxx11::string::string((string *)&buildstr,"",(allocator *)&assignments);
        WriteVariable((ostream *)&variable_assignments,(string *)(p_Var2 + 1),(string *)(p_Var2 + 2)
                      ,&buildstr,1);
        std::__cxx11::string::~string((string *)&buildstr);
      }
      std::__cxx11::string::string((string *)&buildstr,(string *)&build);
      std::__cxx11::stringbuf::str();
      if (((int)local_29c < 1) ||
         (buildstr._M_string_length + arguments._M_string_length + assignments._M_string_length <=
          (ulong)local_29c)) {
        bVar1 = false;
      }
      else {
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        local_248._M_string_length = 0;
        local_248.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringbuf::str(local_1a0);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::string((string *)&local_248,"RSP_FILE",&local_2b9);
        std::__cxx11::string::string((string *)&local_1c8,"",&local_2ba);
        WriteVariable((ostream *)&variable_assignments,&local_248,rspfile,&local_1c8,1);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)&assignments);
        std::__cxx11::string::~string((string *)&local_248);
        bVar1 = true;
      }
      if (usedResponseFile != (bool *)0x0) {
        *usedResponseFile = bVar1;
      }
      poVar3 = std::operator<<(local_2b8,(string *)&buildstr);
      poVar3 = std::operator<<(poVar3,(string *)&arguments);
      std::operator<<(poVar3,(string *)&assignments);
      std::__cxx11::string::~string((string *)&assignments);
      std::__cxx11::string::~string((string *)&buildstr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variable_assignments);
      std::__cxx11::string::~string((string *)&build);
      std::__cxx11::string::~string((string *)&arguments);
      return;
    }
    m2 = (comment->_M_dataplus)._M_p;
    pcVar5 = "No output files for WriteBuildStatement! called with comment: ";
  }
  cmSystemTools::Error(pcVar5,m2,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteBuild(std::ostream& os,
                                        const std::string& comment,
                                        const std::string& rule,
                                        const cmNinjaDeps& outputs,
                                        const cmNinjaDeps& explicitDeps,
                                        const cmNinjaDeps& implicitDeps,
                                        const cmNinjaDeps& orderOnlyDeps,
                                        const cmNinjaVars& variables,
                                        const std::string& rspfile,
                                        int cmdLineLimit,
                                        bool* usedResponseFile)
{
  // Make sure there is a rule.
  if(rule.empty())
    {
    cmSystemTools::Error("No rule for WriteBuildStatement! called "
                         "with comment: ",
                         comment.c_str());
    return;
    }

  // Make sure there is at least one output file.
  if(outputs.empty())
    {
    cmSystemTools::Error("No output files for WriteBuildStatement! called "
                         "with comment: ",
                         comment.c_str());
    return;
    }

  cmGlobalNinjaGenerator::WriteComment(os, comment);

  std::string arguments;

  // TODO: Better formatting for when there are multiple input/output files.

  // Write explicit dependencies.
  for(cmNinjaDeps::const_iterator i = explicitDeps.begin();
      i != explicitDeps.end();
      ++i)
    {
    arguments += " " + EncodeIdent(EncodePath(*i), os);
    }

  // Write implicit dependencies.
  if(!implicitDeps.empty())
    {
    arguments += " |";
    for(cmNinjaDeps::const_iterator i = implicitDeps.begin();
        i != implicitDeps.end();
        ++i)
      arguments += " " + EncodeIdent(EncodePath(*i), os);
    }

  // Write order-only dependencies.
  if(!orderOnlyDeps.empty())
    {
    arguments += " ||";
    for(cmNinjaDeps::const_iterator i = orderOnlyDeps.begin();
        i != orderOnlyDeps.end();
        ++i)
      arguments += " " + EncodeIdent(EncodePath(*i), os);
    }

  arguments += "\n";

  std::string build;

  // Write outputs files.
  build += "build";
  for(cmNinjaDeps::const_iterator i = outputs.begin();
      i != outputs.end(); ++i)
    {
    build += " " + EncodeIdent(EncodePath(*i), os);
    if (this->ComputingUnknownDependencies)
      {
      this->CombinedBuildOutputs.insert( EncodePath(*i) );
      }
    }
  build += ":";

  // Write the rule.
  build += " " + rule;

  // Write the variables bound to this build statement.
  std::ostringstream variable_assignments;
  for(cmNinjaVars::const_iterator i = variables.begin();
      i != variables.end(); ++i)
    cmGlobalNinjaGenerator::WriteVariable(variable_assignments,
                                          i->first, i->second, "", 1);

  // check if a response file rule should be used
  std::string buildstr = build;
  std::string assignments = variable_assignments.str();
  const std::string& args = arguments;
  bool useResponseFile = false;
  if (cmdLineLimit > 0
      && args.size() + buildstr.size() + assignments.size()
                                                    > (size_t) cmdLineLimit) {
    variable_assignments.str(std::string());
    cmGlobalNinjaGenerator::WriteVariable(variable_assignments,
                                          "RSP_FILE", rspfile, "", 1);
    assignments += variable_assignments.str();
    useResponseFile = true;
  }
  if (usedResponseFile)
    {
    *usedResponseFile = useResponseFile;
    }

  os << buildstr << args << assignments;
}